

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

Stream * rw::ps2::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  uint32 uVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint32 buf [2];
  undefined8 local_38;
  
  local_38 = in_RAX;
  bVar3 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar3) {
    uVar4 = Stream::readU32(stream);
    if (uVar4 == 4) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 94"
      ;
      puVar5 = (undefined4 *)(*DAT_00149de8)(0x10,0x3000f);
      *(undefined4 **)((long)object + 0x98) = puVar5;
      *puVar5 = 4;
      uVar1 = *(ushort *)(*(long *)((long)object + 0x90) + 4);
      puVar5[1] = (uint)uVar1;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 99"
      ;
      uVar6 = (*DAT_00149de8)((ulong)uVar1 << 5,0x3000f);
      *(undefined8 *)(puVar5 + 2) = uVar6;
      if (puVar5[1] == 0) {
        return stream;
      }
      puVar8 = (undefined8 *)(*(long *)((long)object + 0x90) + 0x20);
      lVar10 = 0;
      uVar11 = 0;
      do {
        lVar2 = *(long *)(puVar5 + 2);
        Stream::read32(stream,&local_38,8);
        *(int *)(lVar2 + lVar10) = (int)local_38;
        allocLocation =
             "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 106"
        ;
        lVar7 = (*DAT_00149de8)((int)local_38 + 0x7f,0x3000f);
        *(long *)(lVar2 + 8 + lVar10) = lVar7;
        uVar9 = lVar7 + 0x7fU & 0xffffffffffffff80;
        *(ulong *)(lVar2 + 0x10 + lVar10) = uVar9;
        (*stream->_vptr_Stream[4])(stream,uVar9,(ulong)*(uint *)(lVar2 + lVar10));
        *(undefined8 *)(lVar2 + 0x18 + lVar10) = *puVar8;
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x20;
        puVar8 = puVar8 + 3;
      } while (uVar11 < (uint)puVar5[1]);
      return stream;
    }
    readNativeData((ps2 *)(ulong)uVar4);
  }
  else {
    readNativeData();
  }
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_PS2){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_PS2;
	assert(geometry->meshHeader != nil);
	header->numMeshes = geometry->meshHeader->numMeshes;
	header->instanceMeshes = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);
	Mesh *m = geometry->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		uint32 buf[2];
		stream->read32(buf, 8);
		instance->dataSize = buf[0];
		instance->dataRaw = rwNewT(uint8, instance->dataSize+0x7F, MEMDUR_EVENT | ID_GEOMETRY);
		instance->data = ALIGNPTR(instance->dataRaw, 0x80);
#ifdef RW_PS2
		uint32 a = (uint32)instance->data;
		assert(a % 0x10 == 0);
#endif
		stream->read8(instance->data, instance->dataSize);
#ifdef RW_PS2
		if(!buf[1])
			fixDmaOffsets(instance);
#endif
		instance->material = m->material;
//		sizedebug(instance);
		m++;
	}
	return stream;
}